

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_nonblock_begin(nk_context *ctx,nk_flags flags,nk_rect body,nk_rect header,
                     nk_panel_type panel_type)

{
  nk_window *win_00;
  nk_buffer *pnVar1;
  nk_handle nVar2;
  nk_size nVar3;
  nk_size nVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  nk_panel *pnVar13;
  nk_rect r;
  nk_panel *local_78;
  nk_panel *root_1;
  nk_panel *root;
  int in_header;
  int in_body;
  int pressed;
  int is_active;
  nk_panel *panel;
  nk_window *win;
  nk_window *popup;
  nk_panel_type panel_type_local;
  nk_flags flags_local;
  nk_context *ctx_local;
  nk_rect header_local;
  nk_rect body_local;
  
  in_body = 1;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4194,
                  "int nk_nonblock_begin(struct nk_context *, nk_flags, struct nk_rect, struct nk_rect, enum nk_panel_type)"
                 );
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4195,
                  "int nk_nonblock_begin(struct nk_context *, nk_flags, struct nk_rect, struct nk_rect, enum nk_panel_type)"
                 );
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4196,
                  "int nk_nonblock_begin(struct nk_context *, nk_flags, struct nk_rect, struct nk_rect, enum nk_panel_type)"
                 );
  }
  if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
     (ctx->current->layout == (nk_panel *)0x0)) {
    body_local.w = 0.0;
  }
  else {
    win_00 = ctx->current;
    if ((win_00->layout->type &
        (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP)) !=
        NK_PANEL_NONE) {
      __assert_fail("!(panel->type & NK_PANEL_SET_POPUP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x419d,
                    "int nk_nonblock_begin(struct nk_context *, nk_flags, struct nk_rect, struct nk_rect, enum nk_panel_type)"
                   );
    }
    win = (win_00->popup).win;
    if (win == (nk_window *)0x0) {
      win = (nk_window *)nk_create_window(ctx);
      win->parent = win_00;
      (win_00->popup).win = win;
      (win_00->popup).type = panel_type;
      nk_command_buffer_init(&win->buffer,&ctx->memory,NK_CLIPPING_ON);
    }
    else {
      iVar10 = nk_input_is_mouse_pressed(&ctx->input,NK_BUTTON_LEFT);
      iVar11 = nk_input_is_mouse_hovering_rect(&ctx->input,body);
      iVar12 = nk_input_is_mouse_hovering_rect(&ctx->input,header);
      if ((iVar10 != 0) && ((iVar11 == 0 || (iVar12 != 0)))) {
        in_body = 0;
      }
    }
    (win_00->popup).header.x = (float)(int)header._0_8_;
    (win_00->popup).header.y = (float)(int)((ulong)header._0_8_ >> 0x20);
    (win_00->popup).header.w = (float)(int)header._8_8_;
    (win_00->popup).header.h = (float)(int)((ulong)header._8_8_ >> 0x20);
    if (in_body == 0) {
      for (root_1 = win_00->layout; root_1 != (nk_panel *)0x0; root_1 = root_1->parent) {
        root_1->flags = root_1->flags | 0x10000;
      }
      body_local.w = (float)in_body;
    }
    else {
      (win->bounds).x = (float)(int)body._0_8_;
      (win->bounds).y = (float)(int)((ulong)body._0_8_ >> 0x20);
      (win->bounds).w = (float)(int)body._8_8_;
      (win->bounds).h = (float)(int)((ulong)body._8_8_ >> 0x20);
      win->parent = win_00;
      pnVar13 = (nk_panel *)nk_create_panel(ctx);
      win->layout = pnVar13;
      win->flags = flags;
      win->flags = win->flags | 1;
      win->flags = win->flags | 0x800;
      win->seq = ctx->seq;
      (win_00->popup).active = 1;
      if (win->layout == (nk_panel *)0x0) {
        __assert_fail("popup->layout",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                      ,0x41c3,
                      "int nk_nonblock_begin(struct nk_context *, nk_flags, struct nk_rect, struct nk_rect, enum nk_panel_type)"
                     );
      }
      nk_start_popup(ctx,win_00);
      pnVar1 = (win_00->buffer).base;
      fVar8 = (win_00->buffer).clip.x;
      fVar9 = (win_00->buffer).clip.y;
      fVar5 = (win_00->buffer).clip.w;
      fVar6 = (win_00->buffer).clip.h;
      iVar10 = (win_00->buffer).use_clipping;
      uVar7 = *(undefined4 *)&(win_00->buffer).field_0x1c;
      nVar2 = (win_00->buffer).userdata;
      nVar3 = (win_00->buffer).begin;
      nVar4 = (win_00->buffer).last;
      (win->buffer).end = (win_00->buffer).end;
      (win->buffer).last = nVar4;
      (win->buffer).userdata = nVar2;
      (win->buffer).begin = nVar3;
      (win->buffer).clip.w = fVar5;
      (win->buffer).clip.h = fVar6;
      (win->buffer).use_clipping = iVar10;
      *(undefined4 *)&(win->buffer).field_0x1c = uVar7;
      (win->buffer).base = pnVar1;
      (win->buffer).clip.x = fVar8;
      (win->buffer).clip.y = fVar9;
      r.w = 16384.0;
      r.h = 16384.0;
      r.x = -8192.0;
      r.y = -8192.0;
      nk_push_scissor(&win->buffer,r);
      ctx->current = win;
      nk_panel_begin(ctx,(char *)0x0,panel_type);
      memcpy(&win_00->buffer,&win->buffer,0x40);
      win->layout->parent = win_00->layout;
      win->layout->offset_x = &(win->scrollbar).x;
      win->layout->offset_y = &(win->scrollbar).y;
      for (local_78 = win_00->layout; local_78 != (nk_panel *)0x0; local_78 = local_78->parent) {
        local_78->flags = local_78->flags | 0x1000;
      }
      body_local.w = (float)in_body;
    }
  }
  return (int)body_local.w;
}

Assistant:

NK_LIB int
nk_nonblock_begin(struct nk_context *ctx,
    nk_flags flags, struct nk_rect body, struct nk_rect header,
    enum nk_panel_type panel_type)
{
    struct nk_window *popup;
    struct nk_window *win;
    struct nk_panel *panel;
    int is_active = nk_true;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    /* popups cannot have popups */
    win = ctx->current;
    panel = win->layout;
    NK_ASSERT(!(panel->type & NK_PANEL_SET_POPUP));
    (void)panel;
    popup = win->popup.win;
    if (!popup) {
        /* create window for nonblocking popup */
        popup = (struct nk_window*)nk_create_window(ctx);
        popup->parent = win;
        win->popup.win = popup;
        win->popup.type = panel_type;
        nk_command_buffer_init(&popup->buffer, &ctx->memory, NK_CLIPPING_ON);
    } else {
        /* close the popup if user pressed outside or in the header */
        int pressed, in_body, in_header;
        pressed = nk_input_is_mouse_pressed(&ctx->input, NK_BUTTON_LEFT);
        in_body = nk_input_is_mouse_hovering_rect(&ctx->input, body);
        in_header = nk_input_is_mouse_hovering_rect(&ctx->input, header);
        if (pressed && (!in_body || in_header))
            is_active = nk_false;
    }
    win->popup.header = header;

    if (!is_active) {
        /* remove read only mode from all parent panels */
        struct nk_panel *root = win->layout;
        while (root) {
            root->flags |= NK_WINDOW_REMOVE_ROM;
            root = root->parent;
        }
        return is_active;
    }
    popup->bounds = body;
    popup->parent = win;
    popup->layout = (struct nk_panel*)nk_create_panel(ctx);
    popup->flags = flags;
    popup->flags |= NK_WINDOW_BORDER;
    popup->flags |= NK_WINDOW_DYNAMIC;
    popup->seq = ctx->seq;
    win->popup.active = 1;
    NK_ASSERT(popup->layout);

    nk_start_popup(ctx, win);
    popup->buffer = win->buffer;
    nk_push_scissor(&popup->buffer, nk_null_rect);
    ctx->current = popup;

    nk_panel_begin(ctx, 0, panel_type);
    win->buffer = popup->buffer;
    popup->layout->parent = win->layout;
    popup->layout->offset_x = &popup->scrollbar.x;
    popup->layout->offset_y = &popup->scrollbar.y;

    /* set read only mode to all parent panels */
    {struct nk_panel *root;
    root = win->layout;
    while (root) {
        root->flags |= NK_WINDOW_ROM;
        root = root->parent;
    }}
    return is_active;
}